

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t uVar1;
  long in_RDI;
  uint r;
  uint i;
  uint64_t v [16];
  uint64_t m [16];
  uint local_120;
  uint local_11c;
  ulong local_118 [4];
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  ulong local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint64_t auStack_98 [18];
  long local_8;
  
  local_8 = in_RDI;
  for (local_11c = 0; local_11c < 0x10; local_11c = local_11c + 1) {
    uVar1 = load64((void *)0x128f9e);
    auStack_98[local_11c] = uVar1;
  }
  for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
    local_118[local_11c] = *(ulong *)(local_8 + (ulong)local_11c * 8);
  }
  local_d8 = 0x6a09e667f3bcc908;
  local_d0 = 0xbb67ae8584caa73b;
  local_c8 = 0x3c6ef372fe94f82b;
  local_c0 = 0xa54ff53a5f1d36f1;
  local_b8 = *(ulong *)(local_8 + 0x40) ^ 0x510e527fade682d1;
  local_b0 = *(ulong *)(local_8 + 0x48) ^ 0x9b05688c2b3e6c1f;
  local_a8 = *(ulong *)(local_8 + 0x50) ^ 0x1f83d9abfb41bd6b;
  local_a0 = *(ulong *)(local_8 + 0x58) ^ 0x5be0cd19137e2179;
  for (local_120 = 0; local_120 < 0xc; local_120 = local_120 + 1) {
    local_118[0] = local_118[0] + local_f8 + auStack_98[blake2b_sigma[local_120][0]];
    local_b8 = rotr64(local_b8 ^ local_118[0],0x20);
    local_d8 = local_d8 + local_b8;
    local_f8 = rotr64(local_f8 ^ local_d8,0x18);
    local_118[0] = local_118[0] + local_f8 + auStack_98[blake2b_sigma[local_120][1]];
    local_b8 = rotr64(local_b8 ^ local_118[0],0x10);
    local_d8 = local_d8 + local_b8;
    local_f8 = rotr64(local_f8 ^ local_d8,0x3f);
    local_118[1] = local_118[1] + local_f0 + auStack_98[blake2b_sigma[local_120][2]];
    local_b0 = rotr64(local_b0 ^ local_118[1],0x20);
    local_d0 = local_d0 + local_b0;
    local_f0 = rotr64(local_f0 ^ local_d0,0x18);
    local_118[1] = local_118[1] + local_f0 + auStack_98[blake2b_sigma[local_120][3]];
    local_b0 = rotr64(local_b0 ^ local_118[1],0x10);
    local_d0 = local_d0 + local_b0;
    local_f0 = rotr64(local_f0 ^ local_d0,0x3f);
    local_118[2] = local_118[2] + local_e8 + auStack_98[blake2b_sigma[local_120][4]];
    local_a8 = rotr64(local_a8 ^ local_118[2],0x20);
    local_c8 = local_c8 + local_a8;
    local_e8 = rotr64(local_e8 ^ local_c8,0x18);
    local_118[2] = local_118[2] + local_e8 + auStack_98[blake2b_sigma[local_120][5]];
    local_a8 = rotr64(local_a8 ^ local_118[2],0x10);
    local_c8 = local_c8 + local_a8;
    local_e8 = rotr64(local_e8 ^ local_c8,0x3f);
    local_118[3] = local_118[3] + local_e0 + auStack_98[blake2b_sigma[local_120][6]];
    local_a0 = rotr64(local_a0 ^ local_118[3],0x20);
    local_c0 = local_c0 + local_a0;
    local_e0 = rotr64(local_e0 ^ local_c0,0x18);
    local_118[3] = local_118[3] + local_e0 + auStack_98[blake2b_sigma[local_120][7]];
    local_a0 = rotr64(local_a0 ^ local_118[3],0x10);
    local_c0 = local_c0 + local_a0;
    local_e0 = rotr64(local_e0 ^ local_c0,0x3f);
    local_118[0] = local_118[0] + local_f0 + auStack_98[blake2b_sigma[local_120][8]];
    local_a0 = rotr64(local_a0 ^ local_118[0],0x20);
    local_c8 = local_c8 + local_a0;
    local_f0 = rotr64(local_f0 ^ local_c8,0x18);
    local_118[0] = local_118[0] + local_f0 + auStack_98[blake2b_sigma[local_120][9]];
    local_a0 = rotr64(local_a0 ^ local_118[0],0x10);
    local_c8 = local_c8 + local_a0;
    local_f0 = rotr64(local_f0 ^ local_c8,0x3f);
    local_118[1] = local_118[1] + local_e8 + auStack_98[blake2b_sigma[local_120][10]];
    local_b8 = rotr64(local_b8 ^ local_118[1],0x20);
    local_c0 = local_c0 + local_b8;
    local_e8 = rotr64(local_e8 ^ local_c0,0x18);
    local_118[1] = local_118[1] + local_e8 + auStack_98[blake2b_sigma[local_120][0xb]];
    local_b8 = rotr64(local_b8 ^ local_118[1],0x10);
    local_c0 = local_c0 + local_b8;
    local_e8 = rotr64(local_e8 ^ local_c0,0x3f);
    local_118[2] = local_118[2] + local_e0 + auStack_98[blake2b_sigma[local_120][0xc]];
    local_b0 = rotr64(local_b0 ^ local_118[2],0x20);
    local_d8 = local_d8 + local_b0;
    local_e0 = rotr64(local_e0 ^ local_d8,0x18);
    local_118[2] = local_118[2] + local_e0 + auStack_98[blake2b_sigma[local_120][0xd]];
    local_b0 = rotr64(local_b0 ^ local_118[2],0x10);
    local_d8 = local_d8 + local_b0;
    local_e0 = rotr64(local_e0 ^ local_d8,0x3f);
    local_118[3] = local_118[3] + local_f8 + auStack_98[blake2b_sigma[local_120][0xe]];
    local_a8 = rotr64(local_a8 ^ local_118[3],0x20);
    local_d0 = local_d0 + local_a8;
    local_f8 = rotr64(local_f8 ^ local_d0,0x18);
    local_118[3] = local_118[3] + local_f8 + auStack_98[blake2b_sigma[local_120][0xf]];
    local_a8 = rotr64(local_a8 ^ local_118[3],0x10);
    local_d0 = local_d0 + local_a8;
    local_f8 = rotr64(local_f8 ^ local_d0,0x3f);
  }
  for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
    *(ulong *)(local_8 + (ulong)local_11c * 8) =
         *(ulong *)(local_8 + (ulong)local_11c * 8) ^ local_118[local_11c] ^
         local_118[local_11c + 8];
  }
  return;
}

Assistant:

static void blake2b_compress(blake2b_state *S, const uint8_t *block) {
	uint64_t m[16];
	uint64_t v[16];
	unsigned int i, r;

	for (i = 0; i < 16; ++i) {
		m[i] = load64(block + i * sizeof(m[i]));
	}

	for (i = 0; i < 8; ++i) {
		v[i] = S->h[i];
	}

	v[8] = blake2b_IV[0];
	v[9] = blake2b_IV[1];
	v[10] = blake2b_IV[2];
	v[11] = blake2b_IV[3];
	v[12] = blake2b_IV[4] ^ S->t[0];
	v[13] = blake2b_IV[5] ^ S->t[1];
	v[14] = blake2b_IV[6] ^ S->f[0];
	v[15] = blake2b_IV[7] ^ S->f[1];

#define G(r, i, a, b, c, d)                                                    \
    do {                                                                       \
        a = a + b + m[blake2b_sigma[r][2 * i + 0]];                            \
        d = rotr64(d ^ a, 32);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 24);                                                 \
        a = a + b + m[blake2b_sigma[r][2 * i + 1]];                            \
        d = rotr64(d ^ a, 16);                                                 \
        c = c + d;                                                             \
        b = rotr64(b ^ c, 63);                                                 \
    } while ((void)0, 0)

#define ROUND(r)                                                               \
    do {                                                                       \
        G(r, 0, v[0], v[4], v[8], v[12]);                                      \
        G(r, 1, v[1], v[5], v[9], v[13]);                                      \
        G(r, 2, v[2], v[6], v[10], v[14]);                                     \
        G(r, 3, v[3], v[7], v[11], v[15]);                                     \
        G(r, 4, v[0], v[5], v[10], v[15]);                                     \
        G(r, 5, v[1], v[6], v[11], v[12]);                                     \
        G(r, 6, v[2], v[7], v[8], v[13]);                                      \
        G(r, 7, v[3], v[4], v[9], v[14]);                                      \
    } while ((void)0, 0)

	for (r = 0; r < 12; ++r) {
		ROUND(r);
	}

	for (i = 0; i < 8; ++i) {
		S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
	}

#undef G
#undef ROUND
}